

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cunit.c
# Opt level: O3

void cunit_named_check(_Bool cond,char *name,int line,char *format,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (_cond == 0) {
    fail = fail + 1;
    local_e8 = 0x3000000020;
    local_e0 = &ap[0].overflow_arg_area;
    local_d8 = local_c8;
    local_a8 = in_R8;
    local_a0 = in_R9;
    printf("\t%s (%d) fail: ");
    vprintf(format,&local_e8);
    puts("\n");
  }
  else {
    success = success + 1;
  }
  return;
}

Assistant:

void
cunit_named_check(bool cond, const char *name, int line, const char *format, ...) {
  va_list ap;

  if (cond) {
    success++;
    return;
  }

  fail++;

  va_start(ap, format);

  printf("\t%s (%d) fail: ", name, line);
  vprintf(format, ap);
  puts("\n");
  va_end(ap);
}